

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test<BinTrees::RBTree<int>>(void)

{
  RBTree<int> *pRVar1;
  ostream *poVar2;
  long lVar3;
  int *piVar4;
  initializer_list<int> l;
  int sum;
  RBTree<int> local_88 [3];
  
  sum = 0;
  piVar4 = &DAT_001030bc;
  pRVar1 = local_88;
  for (lVar3 = 0x1e; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pRVar1->super_BinSTree<int>).super_BinTree<int>.v = *piVar4;
    piVar4 = piVar4 + 1;
    pRVar1 = (RBTree<int> *)&(pRVar1->super_BinSTree<int>).super_BinTree<int>.field_0x4;
  }
  l._M_len = (size_type)&sum;
  l._M_array = (iterator)0x1e;
  pRVar1 = BinTrees::RBTree<int>::gen(local_88,l,(int *)0x0);
  poVar2 = std::operator<<((ostream *)&std::cout,"root:");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar2,(pRVar1->super_BinSTree<int>).super_BinTree<int>.v);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"result:");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,sum);
  std::endl<char,std::char_traits<char>>(poVar2);
  BinTrees::BinSTree<int>::~BinSTree(&pRVar1->super_BinSTree<int>);
  operator_delete(pRVar1,0x28);
  return;
}

Assistant:

void test() {
    int sum = 0;
    auto *t = T::gen({3566, 2472, 1180, 2948, 2286, 4414, 1207, 2110, 1951, 4271,
                      1690, 3574, 4297, 4232, 2609, 1367, 3893, 1693, 1997, 1589,
                      3140, 2063, 2359, 3291, 2699, 4179, 2333, 3786, 1458, 3427}, sum);

    cout << "root:" << t->V() << endl << "result:" << sum << endl;

    delete t;
}